

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

double get_decfun_bias(model *model_,int label_idx)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  
  dVar5 = 0.0;
  if (0.0 < model_->bias) {
    lVar4 = (long)model_->nr_feature;
    if (-1 < lVar4) {
      iVar1 = (model_->param).solver_type;
      pdVar3 = model_->w;
      if (iVar1 - 0xbU < 3) {
        dVar5 = pdVar3[lVar4];
      }
      else {
        iVar2 = model_->nr_class;
        if (-1 < label_idx && label_idx < iVar2) {
          if (iVar1 == 4 || iVar2 != 2) {
            dVar5 = pdVar3[(uint)(iVar2 * model_->nr_feature + label_idx)];
          }
          else {
            dVar5 = pdVar3[lVar4];
            if (label_idx != 0) {
              dVar5 = -dVar5;
            }
          }
        }
      }
    }
    dVar5 = model_->bias * dVar5;
  }
  return dVar5;
}

Assistant:

double get_decfun_bias(const struct model *model_, int label_idx)
{
	int bias_idx = model_->nr_feature;
	double bias = model_->bias;
	if(bias <= 0)
		return 0;
	else
		return bias*get_w_value(model_, bias_idx, label_idx);
}